

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandler * __thiscall
Js::SimpleTypeHandler<2UL>::ConvertToSimpleDictionaryType
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance)

{
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSVar1;
  ScriptContext *pSVar2;
  SimpleDictionaryTypeHandler *newTypeHandler;
  DynamicObject *instance_local;
  SimpleTypeHandler<2UL> *this_local;
  
  pSVar1 = SimpleTypeHandler<2ul>::
           ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     ((SimpleTypeHandler<2ul> *)this,instance);
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertSimpleToSimpleDictionaryCount = pSVar2->convertSimpleToSimpleDictionaryCount + 1;
  return pSVar1;
}

Assistant:

SimpleDictionaryTypeHandler* SimpleTypeHandler<size>::ConvertToSimpleDictionaryType(DynamicObject* instance)
    {
        SimpleDictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<SimpleDictionaryTypeHandler >(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleToSimpleDictionaryCount++;
#endif
        return newTypeHandler;
    }